

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.cpp
# Opt level: O0

void __thiscall
slang::ast::RangeSelectExpression::serializeTo
          (RangeSelectExpression *this,ASTSerializer *serializer)

{
  Expression *pEVar1;
  ASTSerializer *in_RSI;
  RangeSelectExpression *in_RDI;
  string_view sVar2;
  char *in_stack_ffffffffffffff88;
  ASTSerializer *this_00;
  undefined4 local_60;
  undefined8 local_58;
  undefined4 local_50;
  undefined8 local_48;
  undefined4 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined4 local_20;
  undefined8 local_18;
  
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_RDI,in_stack_ffffffffffffff88);
  sVar2 = ast::toString(Simple);
  local_30 = sVar2._M_len;
  ASTSerializer::write(in_RSI,local_20,local_18,local_30);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_RDI,in_stack_ffffffffffffff88);
  pEVar1 = value(in_RDI);
  ASTSerializer::write(in_RSI,local_40,local_38,(size_t)pEVar1);
  this_00 = in_RSI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_RDI,(char *)in_RSI);
  pEVar1 = left(in_RDI);
  ASTSerializer::write(this_00,local_50,local_48,(size_t)pEVar1);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_RDI,(char *)this_00);
  pEVar1 = right(in_RDI);
  ASTSerializer::write(in_RSI,local_60,local_58,(size_t)pEVar1);
  return;
}

Assistant:

void RangeSelectExpression::serializeTo(ASTSerializer& serializer) const {
    serializer.write("selectionKind", toString(selectionKind));
    serializer.write("value", value());
    serializer.write("left", left());
    serializer.write("right", right());
}